

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::flush_dependees(Compiler *this,SPIRVariable *var)

{
  uint32_t local_38;
  uint32_t local_34;
  TypedID<(spirv_cross::Types)0> *pTStack_30;
  TypedID<(spirv_cross::Types)0> expr;
  TypedID<(spirv_cross::Types)0> *__end1;
  TypedID<(spirv_cross::Types)0> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1;
  SPIRVariable *var_local;
  Compiler *this_local;
  
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     (&(var->dependees).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  pTStack_30 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                         (&(var->dependees).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  for (; __end1 != pTStack_30; __end1 = __end1 + 1) {
    local_34 = __end1->id;
    local_38 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_34);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->invalid_expressions,&local_38);
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::clear(&var->dependees);
  return;
}

Assistant:

void Compiler::flush_dependees(SPIRVariable &var)
{
	for (auto expr : var.dependees)
		invalid_expressions.insert(expr);
	var.dependees.clear();
}